

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar1;
  Transform local_80 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_00185b50;
  pTVar1 = (ThreeAxisForceTorqueContactSensorPrivateAttributes *)operator_new(0xc0);
  (pTVar1->name)._M_dataplus._M_p = (pointer)&(pTVar1->name).field_2;
  (pTVar1->name)._M_string_length = 0;
  (pTVar1->name).field_2._M_local_buf[0] = '\0';
  iDynTree::Transform::Transform(&pTVar1->link_H_sensor);
  (pTVar1->parent_link_name)._M_dataplus._M_p = (pointer)&(pTVar1->parent_link_name).field_2;
  (pTVar1->parent_link_name)._M_string_length = 0;
  (pTVar1->parent_link_name).field_2._M_local_buf[0] = '\0';
  (pTVar1->m_loadCellLocations).
  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar1->m_loadCellLocations).
  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar1->m_loadCellLocations).
  super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pimpl = pTVar1;
  std::__cxx11::string::_M_replace((ulong)pTVar1,0,(char *)(pTVar1->name)._M_string_length,0x16f785)
  ;
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,local_80);
  pTVar1 = this->pimpl;
  pTVar1->parent_link_index = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&pTVar1->parent_link_name,0,(char *)(pTVar1->parent_link_name)._M_string_length,
             0x16f785);
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor()
{
    this->pimpl = new ThreeAxisForceTorqueContactSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";

}